

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O0

void proxy_log(proxy_handle *ph,LOG_LEVEL lvl,char *fmt,...)

{
  void *pvVar1;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_f8 [24];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined1 local_48 [8];
  va_list args;
  proxy_priv *priv;
  char *fmt_local;
  LOG_LEVEL lvl_local;
  proxy_handle *ph_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  pvVar1 = ph->priv;
  if ((pvVar1 != (void *)0x0) && (lvl <= *(LOG_LEVEL *)((long)pvVar1 + 0x868))) {
    args[0].overflow_arg_area = local_f8;
    args[0]._0_8_ = &stack0x00000008;
    local_48._4_4_ = 0x30;
    local_48._0_4_ = 0x18;
    local_e0 = in_RCX;
    local_d8 = in_R8;
    local_d0 = in_R9;
    log_vprintf((log_handle *)((long)pvVar1 + 0x860),lvl,fmt,(__va_list_tag *)local_48);
  }
  return;
}

Assistant:

void proxy_log(struct proxy_handle *ph, enum LOG_LEVEL lvl,
	       const char *fmt, ...)
{
	struct proxy_priv *priv = ph->priv;
	va_list args;

	if (priv == NULL || (unsigned int)lvl > priv->log.level)
		return;

	va_start(args, fmt);
	log_vprintf(&priv->log, lvl, fmt, args);
	va_end(args);
}